

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_size_test.cc
# Opt level: O1

void test_insertion<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<MemoryMapping,boost::intrusive::tree_node_traits<void*>,(boost::intrusive::link_mode_type)1,boost::intrusive::dft_tag,6u>,false>>
               (MemoryContainer<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<MemoryMapping,_boost::intrusive::tree_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_boost::intrusive::dft_tag,_6U>,_false>_>
                *c,vector<MemoryMapping,_std::allocator<MemoryMapping>_> *values,size_t numRepeat)

{
  int iVar1;
  time_duration_type tVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vector<double,_std::allocator<double>_> local_98;
  double local_78;
  double local_70;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_68;
  double local_60;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  local_68.time_.time_count_.value_._0_4_ = 0xfffffffe;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x7ffffffffffffffe;
  boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>::
  counted_time_rep(&local_58.time_,(date_type *)&local_68,(time_duration_type *)&local_98);
  local_78 = (double)CONCAT44(local_78._4_4_,0xfffffffe);
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x7ffffffffffffffe;
  boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>::
  counted_time_rep(&local_68.time_,(date_type *)&local_78,(time_duration_type *)&local_98);
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_70 = (double)numRepeat;
  if (numRepeat != 0) {
    dVar6 = 0.0;
    do {
      (*c->_vptr_MemoryContainer[3])(c);
      local_58.time_.time_count_.value_ =
           (time_rep_type)
           boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                     (boost::date_time::c_time::gmtime);
      lVar4 = (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar4 != 0) {
        lVar4 = (lVar4 >> 3) * -0xf0f0f0f0f0f0f0f;
        lVar5 = 0;
        do {
          (**c->_vptr_MemoryContainer)
                    (c,(long)&(((values->
                                super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                                _M_impl.super__Vector_impl_data._M_start)->
                              super_set_base_hook<boost::intrusive::optimize_size<false>_>).
                              super_type.super_type.super_rbtree_node<void_*>.parent_ + lVar5);
          lVar5 = lVar5 + 0x88;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      local_68.time_.time_count_.value_ =
           (time_rep_type)
           boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                     (boost::date_time::c_time::gmtime);
      tVar2 = boost::date_time::
              counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
              ::subtract_times(&local_68.time_,&local_58.time_);
      numRepeat = (size_t)local_70;
      lVar4 = ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
      auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = 0x45300000;
      local_78 = (double)((long)tVar2.
                                super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                .ticks_.value_ * 1000) /
                 ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_78);
      }
      else {
        *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_78;
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      iVar1 = (*c->_vptr_MemoryContainer[4])(c);
      if (CONCAT44(extraout_var,iVar1) !=
          ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"    ERROR: size not consistent",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
      }
      dVar6 = (double)((long)dVar6 + 1);
    } while (dVar6 != (double)numRepeat);
  }
  local_60 = 0.0;
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_60 = 0.0;
  }
  else {
    do {
      local_60 = local_60 +
                 local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    } while (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  auVar8._8_4_ = (int)(numRepeat >> 0x20);
  auVar8._0_8_ = numRepeat;
  auVar8._12_4_ = 0x45300000;
  dStack_40 = auVar8._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)numRepeat) - 4503599627370496.0);
  std::ostream::_M_insert<double>(local_60 / local_48);
  if ((double)numRepeat != 0.0) {
    dVar6 = 0.0;
    do {
      local_58.time_.time_count_.value_ =
           (time_rep_type)
           boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                     (boost::date_time::c_time::gmtime);
      lVar4 = (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      local_60 = dVar6;
      if (lVar4 == 0) {
        lVar4 = 0;
      }
      else {
        lVar7 = (lVar4 >> 3) * -0xf0f0f0f0f0f0f0f;
        lVar5 = 0;
        lVar4 = 0;
        do {
          (*c->_vptr_MemoryContainer[1])(&local_78,c);
          (*c->_vptr_MemoryContainer[2])
                    (&local_50,c,
                     (long)&(((values->
                              super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                              _M_impl.super__Vector_impl_data._M_start)->
                            super_set_base_hook<boost::intrusive::optimize_size<false>_>).super_type
                            .super_type.super_rbtree_node<void_*>.parent_ + lVar5);
          lVar4 = lVar4 + (ulong)(local_78 != local_50);
          lVar5 = lVar5 + 0x88;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      local_68.time_.time_count_.value_ =
           (time_rep_type)
           boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                     (boost::date_time::c_time::gmtime);
      dVar6 = local_60;
      tVar2 = boost::date_time::
              counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
              ::subtract_times(&local_68.time_,&local_58.time_);
      lVar5 = ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
      auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar10._0_8_ = lVar5;
      auVar10._12_4_ = 0x45300000;
      local_78 = (double)((long)tVar2.
                                super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                .ticks_.value_ * 1000) /
                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
      if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_78);
      }
      else {
        *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_78;
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      if (lVar4 != ((long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(values->super__Vector_base<MemoryMapping,_std::allocator<MemoryMapping>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"    ERROR: not all found, ",0x1a);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," found out of ",0xe);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      dVar6 = (double)((long)dVar6 + 1);
    } while (dVar6 != local_70);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_70 = 0.0;
  }
  else {
    local_70 = 0.0;
    do {
      local_70 = local_70 +
                 local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    } while (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  std::ostream::_M_insert<double>(local_70 / local_48);
  (*c->_vptr_MemoryContainer[3])(c);
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_insertion(MemoryContainer<Iterator> &c,
                    std::vector<MemoryMapping> &values,
                    std::size_t numRepeat) {
  ptime tini, tend;
  std::vector<double> times;
  // Insert
  {
    for( std::size_t repeat = 0, repeat_max = numRepeat
           ; repeat != repeat_max
           ; ++repeat){
      c.clear();
      tini = microsec_clock::universal_time();
      for( std::size_t i = 0, max = values.size()
             ; i != max
             ; ++i){
        c.insert(values[i]);
      }
      tend = microsec_clock::universal_time();
      times.push_back(double((tend-tini).total_nanoseconds())
                      /double(values.size()));
      //std::cout << "," << times.back();
      if(c.size() != values.size()){
        std::cerr << "    ERROR: size not consistent" << std::endl;
      }
    }
    double total = 0.0;
    while(!times.empty()) {
      total += times.back();
      times.pop_back();
    }
    std::cout << "," << total/numRepeat;
  }
  // Search
  {
    for( std::size_t repeat = 0, repeat_max = numRepeat
           ; repeat != repeat_max
           ; ++repeat){
      std::size_t found = 0;
      tini = microsec_clock::universal_time();
      for( std::size_t i = 0, max = values.size()
             ; i != max
             ; ++i){
        found += static_cast<std::size_t>(c.end() != c.find(values[i]));
      }
      tend = microsec_clock::universal_time();
      times.push_back(double((tend-tini).total_nanoseconds())/
                      double(values.size()));
      //std::cout << "," << times.back();
      if(found != values.size()){
        std::cerr << "    ERROR: not all found, "
                  << found << " found out of " << values.size()
                  << std::endl;
      }
    }
    double total = 0.0;
    while(!times.empty()) {
      total += times.back();
      times.pop_back();
    }
    std::cout << "," << total/numRepeat;
  }
  c.clear();
}